

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O0

void duckdb::NumericStats::TemplatedVerify<unsigned_short>
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  bool bVar1;
  undefined8 uVar2;
  ulong in_RCX;
  SelectionVector *in_RDX;
  BaseStatistics *in_stack_00000008;
  idx_t index;
  idx_t idx;
  idx_t i;
  Value max_value;
  Value min_value;
  unsigned_short *data;
  UnifiedVectorFormat vdata;
  unsigned_short *in_stack_fffffffffffffda8;
  UnifiedVectorFormat *in_stack_fffffffffffffdb0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffdb8;
  allocator *paVar3;
  UnifiedVectorFormat *in_stack_fffffffffffffdc0;
  unsigned_short *left;
  bool local_231;
  undefined4 in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffdee;
  bool bVar4;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  InternalException *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe70;
  unsigned_short in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  idx_t in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  allocator local_141;
  string local_140 [38];
  uint16_t local_11a;
  idx_t local_118;
  idx_t local_110;
  ulong local_108;
  Value local_100;
  Value local_c0;
  unsigned_short *local_80;
  UnifiedVectorFormat local_68;
  ulong local_20;
  SelectionVector *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffdc0);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (UnifiedVectorFormat *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))));
  local_80 = UnifiedVectorFormat::GetData<unsigned_short>(&local_68);
  MinOrNull((BaseStatistics *)
            CONCAT17(in_stack_fffffffffffffdef,
                     CONCAT16(in_stack_fffffffffffffdee,
                              CONCAT24(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))));
  MaxOrNull((BaseStatistics *)
            CONCAT17(in_stack_fffffffffffffdef,
                     CONCAT16(in_stack_fffffffffffffdee,
                              CONCAT24(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))));
  local_108 = 0;
  do {
    if (local_20 <= local_108) {
      Value::~Value((Value *)in_stack_fffffffffffffdb0);
      Value::~Value((Value *)in_stack_fffffffffffffdb0);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffdb0);
      return;
    }
    local_110 = SelectionVector::get_index(local_18,local_108);
    local_118 = SelectionVector::get_index(local_68.sel,local_110);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffdb8,(idx_t)in_stack_fffffffffffffdb0);
    if (bVar1) {
      bVar1 = Value::IsNull(&local_c0);
      bVar4 = false;
      if (!bVar1) {
        local_11a = Value::GetValueUnsafe<unsigned_short>(&local_c0);
        bVar4 = LessThan::Operation<unsigned_short>
                          ((unsigned_short *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      }
      if (bVar4 != false) {
        uVar2 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_140,
                   "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
                   &local_141);
        BaseStatistics::ToString_abi_cxx11_(in_stack_00000008);
        Vector::ToString_abi_cxx11_
                  ((Vector *)
                   max_value.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi,(idx_t)max_value.type_.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe38);
        __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
      }
      bVar1 = Value::IsNull(&local_100);
      local_231 = false;
      if (!bVar1) {
        left = local_80 + local_118;
        Value::GetValueUnsafe<unsigned_short>(&local_100);
        local_231 = GreaterThan::Operation<unsigned_short>
                              (left,(unsigned_short *)&stack0xfffffffffffffe74);
      }
      if (local_231 != false) {
        uVar2 = __cxa_allocate_exception(0x10);
        paVar3 = (allocator *)&stack0xfffffffffffffe4f;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffe50,
                   "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
                   paVar3);
        BaseStatistics::ToString_abi_cxx11_(in_stack_00000008);
        Vector::ToString_abi_cxx11_
                  ((Vector *)
                   max_value.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi,(idx_t)max_value.type_.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe38);
        __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
      }
    }
    local_108 = local_108 + 1;
  } while( true );
}

Assistant:

void NumericStats::TemplatedVerify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel,
                                   idx_t count) {
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	auto min_value = NumericStats::MinOrNull(stats);
	auto max_value = NumericStats::MaxOrNull(stats);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		if (!min_value.IsNull() && LessThan::Operation(data[index], min_value.GetValueUnsafe<T>())) { // LCOV_EXCL_START
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		} // LCOV_EXCL_STOP
		if (!max_value.IsNull() && GreaterThan::Operation(data[index], max_value.GetValueUnsafe<T>())) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
	}
}